

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::TokenizerTest_Errors_DD_Errors_Test::TestBody
          (TokenizerTest_Errors_DD_Errors_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  bool bVar2;
  int iVar3;
  char **ppcVar4;
  char *message;
  char *in_R9;
  long lVar5;
  internal iVar6;
  string_view src;
  ScopedTrace gtest_trace_1184;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  TestInputStream input;
  TestErrorCollector error_collector;
  Tokenizer tokenizer;
  ScopedTrace local_1a1;
  AssertHelper local_1a0;
  Message local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  size_t *local_188;
  undefined1 local_180 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  long local_160;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_158;
  ArrayInputStream local_150;
  undefined4 local_130;
  char **local_128;
  AssertHelper local_120;
  TestErrorCollector local_118;
  size_type *local_f0;
  _Alloc_hider local_e8;
  size_type local_e0 [22];
  
  local_160 = 0;
  do {
    ppcVar4 = (char **)&io::(anonymous_namespace)::kErrorCases;
    local_188 = &io::(anonymous_namespace)::kErrorCases + local_160 * 6;
    local_128 = (char **)(&DAT_01a04de8 + local_160 * 0x30);
    lVar5 = 0;
    do {
      testing::Message::Message((Message *)&local_158);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_158._M_head_impl + 0x10),"kErrorCases case #",0x12);
      std::ostream::operator<<(local_158._M_head_impl + 0x10,(int)local_160);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_158._M_head_impl + 0x10),": ",2);
      _Var1._M_head_impl = local_158._M_head_impl;
      src._M_str = (char *)ppcVar4;
      src._M_len = *local_188;
      absl::lts_20250127::CEscape_abi_cxx11_((string *)&local_f0,(lts_20250127 *)local_188[1],src);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(_Var1._M_head_impl + 0x10),(char *)local_f0,(long)local_e8._M_p);
      if (local_f0 != local_e0) {
        operator_delete(local_f0,local_e0[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_158._M_head_impl + 0x10),", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_158._M_head_impl + 0x10),"kBlockSizes case #",0x12);
      std::ostream::operator<<(local_158._M_head_impl + 0x10,(int)lVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_158._M_head_impl + 0x10),": ",2);
      iVar3 = (&io::(anonymous_namespace)::kBlockSizes)[lVar5];
      std::ostream::operator<<(local_158._M_head_impl + 0x10,iVar3);
      testing::ScopedTrace::ScopedTrace<testing::Message>
                (&local_1a1,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x4a0,(Message *)&local_158);
      if (local_158._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(undefined **)local_158._M_head_impl + 8))();
      }
      local_158._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR__TestInputStream_01949db8;
      ArrayInputStream::ArrayInputStream(&local_150,(void *)*local_188,(int)local_188[1],iVar3);
      local_130 = 0;
      local_118.super_ErrorCollector._vptr_ErrorCollector =
           (_func_int **)&PTR__TestErrorCollector_01949e18;
      local_118.text_._M_dataplus._M_p = (pointer)&local_118.text_.field_2;
      local_118.text_._M_string_length = 0;
      local_118.text_.field_2._M_local_buf[0] = '\0';
      Tokenizer::Tokenizer
                ((Tokenizer *)&local_f0,(ZeroCopyInputStream *)&local_158,
                 &local_118.super_ErrorCollector);
      iVar6 = (internal)0x0;
      while( true ) {
        bVar2 = Tokenizer::Next((Tokenizer *)&local_f0);
        if (!bVar2) break;
        iVar3 = std::__cxx11::string::compare((char *)&local_e8);
        iVar6 = (internal)(iVar3 == 0);
      }
      ppcVar4 = local_128;
      testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
                ((internal *)local_180,"kErrorCases_case.errors","error_collector.text_",local_128,
                 &local_118.text_);
      if (local_180[0] == (internal)0x0) {
        testing::Message::Message(&local_198);
        message = anon_var_dwarf_a12c75 + 5;
        if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = (local_178->_M_dataplus)._M_p;
        }
        ppcVar4 = (char **)0x4ae;
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x4ae,message);
        testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
        testing::internal::AssertHelper::~AssertHelper(&local_1a0);
        if ((long *)CONCAT71(local_198.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._1_7_,
                             local_198.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_1_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_198.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._1_7_,
                                         local_198.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._0_1_) + 8))();
        }
      }
      if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_178,local_178);
      }
      if ((char)local_188[4] == '\x01') {
        local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_198.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ = iVar6;
        if (!(bool)iVar6) {
          testing::Message::Message((Message *)&local_1a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_180,(internal *)&local_198,(AssertionResult *)"last_was_foo",
                     "false","true",in_R9);
          ppcVar4 = (char **)0x4b2;
          testing::internal::AssertHelper::AssertHelper
                    (&local_120,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x4b2,(char *)CONCAT71(local_180._1_7_,local_180[0]));
          testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_120);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_180._1_7_,local_180[0]) != &local_170) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_180._1_7_,local_180[0]),
                            local_170._M_allocated_capacity + 1);
          }
          if (local_1a0.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_1a0.data_ + 8))();
          }
        }
        if (local_190 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_190,local_190);
        }
      }
      Tokenizer::~Tokenizer((Tokenizer *)&local_f0);
      TestErrorCollector::~TestErrorCollector(&local_118);
      testing::ScopedTrace::~ScopedTrace(&local_1a1);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
    local_160 = local_160 + 1;
  } while (local_160 != 0x1c);
  return;
}

Assistant:

TEST_2D(TokenizerTest, Errors, kErrorCases, kBlockSizes) {
  // Set up the tokenizer.
  TestInputStream input(kErrorCases_case.input.data(),
                        kErrorCases_case.input.size(), kBlockSizes_case);
  TestErrorCollector error_collector;
  Tokenizer tokenizer(&input, &error_collector);

  // Ignore all input, except remember if the last token was "foo".
  bool last_was_foo = false;
  while (tokenizer.Next()) {
    last_was_foo = tokenizer.current().text == "foo";
  }

  // Check that the errors match what was expected.
  EXPECT_EQ(kErrorCases_case.errors, error_collector.text_);

  // If the error was recoverable, make sure we saw "foo" after it.
  if (kErrorCases_case.recoverable) {
    EXPECT_TRUE(last_was_foo);
  }
}